

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EpsRefine.h
# Opt level: O0

istream * covenant::operator>>(istream *in,GeneralizationMethod *gen)

{
  bool bVar1;
  undefined8 uVar2;
  undefined4 *in_RSI;
  istream *in_RDI;
  string token;
  string *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator local_61;
  string local_60 [48];
  string local_30 [32];
  undefined4 *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  std::operator>>(local_8,local_30);
  bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  if (bVar1) {
    *local_10 = 0;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"Invalid generalization method",&local_61);
      error::error((error *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      __cxa_throw(uVar2,&error::typeinfo,error::~error);
    }
    *local_10 = 1;
  }
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

std::istream& operator>>(std::istream& in, GeneralizationMethod& gen)
{
    std::string token;
    in >> token;
    if (token == "greedy")
        gen = GREEDY;
    else if (token == "max-gen")
        gen = MAX_GEN;
    else 
      throw error("Invalid generalization method");
    return in;
}